

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O3

void vkt::texture::anon_unknown_0::populateTextureMipmappingTests
               (TestCaseGroup *textureMipmappingTests)

{
  CoordType CVar1;
  TestContext *testCtx;
  char *pcVar2;
  pointer __s;
  _func_int **__s_00;
  char *__s_01;
  bool bVar3;
  ulong uVar4;
  undefined8 uVar5;
  size_t sVar6;
  TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DMipmapTestInstance> *pTVar7;
  TestNode *pTVar8;
  TestNode *pTVar9;
  TextureTestCase<vkt::texture::(anonymous_namespace)::Texture3DMipmapTestInstance> *pTVar10;
  anon_struct_16_2_3f8b7511_conflict *paVar11;
  long lVar12;
  int *piVar13;
  long lVar14;
  char *__end_1;
  anon_struct_24_3_7bec94c7 *paVar15;
  int iVar16;
  char *__end;
  ostringstream name;
  undefined1 auStack_2e8 [8];
  string *local_2e0 [2];
  undefined1 local_2d0 [32];
  TestNode *local_2b0;
  TestNode *local_2a8;
  undefined1 local_2a0 [56];
  pointer local_268;
  CoordType local_260;
  int iStack_25c;
  char *pcStack_258;
  char *local_250;
  TestNode *local_248;
  TestNode *local_240;
  TestNode *local_238;
  long *local_230 [2];
  long local_220 [2];
  TestNode *local_210;
  TestNode *local_208;
  TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DMipmapTestInstance> *local_200;
  TestNode *local_1f8;
  TestNode *local_1f0;
  string *local_1e8 [2];
  string local_1d8;
  anon_struct_16_2_3f8b7511_conflict *local_1b8;
  undefined1 local_1b0 [72];
  char *pcStack_168;
  char *pcStack_160;
  ios_base local_140 [264];
  TestNode *local_38;
  
  testCtx = (textureMipmappingTests->super_TestNode).m_testCtx;
  local_38 = &textureMipmappingTests->super_TestNode;
  local_238 = (TestNode *)operator_new(0x70);
  local_2d0._16_8_ = testCtx;
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)local_238,testCtx,"2d","2D Mipmap Filtering");
  local_240 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_240,(TestContext *)local_2d0._16_8_,"bias",
             "User-supplied bias value");
  local_248 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_248,(TestContext *)local_2d0._16_8_,"min_lod",
             "Lod control: min lod");
  local_2b0 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_2b0,(TestContext *)local_2d0._16_8_,"max_lod",
             "Lod control: max lod");
  local_2a8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_2a8,(TestContext *)local_2d0._16_8_,"base_level","Base level");
  local_1f8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_1f8,(TestContext *)local_2d0._16_8_,"max_level","Max level");
  lVar14 = 0;
  do {
    local_1d8.field_2._M_allocated_capacity = (size_type)operator_new(0x70);
    local_208 = (TestNode *)lVar14;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)local_1d8.field_2._M_allocated_capacity,
               (TestContext *)local_2d0._16_8_,
               populateTextureMipmappingTests::coordTypes[lVar14].name,
               populateTextureMipmappingTests::coordTypes[lVar14].desc);
    CVar1 = populateTextureMipmappingTests::coordTypes[lVar14].type;
    lVar14 = 0;
    do {
      paVar11 = (anon_struct_16_2_3f8b7511_conflict *)0x0;
      local_210 = (TestNode *)lVar14;
      do {
        pTVar8 = (TestNode *)&populateTextureMipmappingTests::tex2DSizes[0].width;
        paVar15 = (anon_struct_24_3_7bec94c7 *)0x0;
        local_1b8 = paVar11;
        do {
          util::Texture2DTestCaseParameters::Texture2DTestCaseParameters
                    ((Texture2DTestCaseParameters *)local_2a0);
          pcStack_258 = (char *)0x0;
          local_2a0._8_4_ = populateTextureMipmappingTests::minFilterModes[lVar14].mode;
          local_2a0._16_4_ = populateTextureMipmappingTests::wrapModes[(long)paVar11].mode;
          local_2a0._24_4_ = VK_FORMAT_R8G8B8A8_UNORM;
          local_268 = ((_Alloc_hider *)&pTVar8->_vptr_TestNode)->_M_p;
          local_1b0._0_4_ = 0;
          local_2a0._20_4_ = local_2a0._16_4_;
          local_260 = CVar1;
          if (local_2a0._40_8_ == local_2a0._48_8_) {
            std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
            _M_realloc_insert<vkt::texture::util::Program>
                      ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                        *)(local_2a0 + 0x20),(iterator)local_2a0._40_8_,(Program *)local_1b0);
          }
          else {
            *(Program *)local_2a0._40_8_ = PROGRAM_2D_FLOAT;
            local_2a0._40_8_ = local_2a0._40_8_ + 4;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
          pcVar2 = populateTextureMipmappingTests::minFilterModes[lVar14].name;
          local_1d8.field_2._8_8_ = paVar15;
          if (pcVar2 == (char *)0x0) {
            std::ios::clear((int)auStack_2e8 +
                            (int)*(undefined8 *)(CONCAT44(local_1b0._4_4_,local_1b0._0_4_) + -0x18)
                            + 0x138);
          }
          else {
            sVar6 = strlen(pcVar2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,pcVar2,sVar6);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"_",1);
          pcVar2 = populateTextureMipmappingTests::wrapModes[(long)paVar11].name;
          if (pcVar2 == (char *)0x0) {
            std::ios::clear((int)auStack_2e8 +
                            (int)*(undefined8 *)(CONCAT44(local_1b0._4_4_,local_1b0._0_4_) + -0x18)
                            + 0x138);
          }
          else {
            sVar6 = strlen(pcVar2);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,pcVar2,sVar6);
          }
          __s = pTVar8[-1].m_children.
                super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
          if (__s != (pointer)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"_",1);
            sVar6 = strlen((char *)__s);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1b0,(char *)__s,sVar6);
          }
          local_200 = (TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DMipmapTestInstance>
                       *)operator_new(0xc0);
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_2e0,(char *)local_230[0],(allocator<char> *)(local_2d0 + 0x1f))
          ;
          local_1e8[0] = &local_1d8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"");
          pTVar7 = local_200;
          local_1f0 = pTVar8;
          util::TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DMipmapTestInstance>::
          TextureTestCase(local_200,(TestContext *)local_2d0._16_8_,local_2e0[0],local_1e8[0],
                          (ParameterType *)local_2a0);
          tcu::TestNode::addChild
                    ((TestNode *)local_1d8.field_2._M_allocated_capacity,(TestNode *)pTVar7);
          if (local_1e8[0] != &local_1d8) {
            operator_delete(local_1e8[0],(ulong)(local_1d8._M_dataplus._M_p + 1));
          }
          uVar5 = local_1d8.field_2._8_8_;
          pTVar8 = local_1f0;
          if (local_2e0[0] != (string *)local_2d0) {
            operator_delete(local_2e0[0],(ulong)(local_2d0._0_8_ + 1));
          }
          if (local_230[0] != local_220) {
            operator_delete(local_230[0],local_220[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
          std::ios_base::~ios_base(local_140);
          if ((pointer)local_2a0._32_8_ != (pointer)0x0) {
            operator_delete((void *)local_2a0._32_8_,local_2a0._48_8_ - local_2a0._32_8_);
          }
          if (CVar1 != COORDTYPE_BASIC) break;
          paVar15 = (anon_struct_24_3_7bec94c7 *)(uVar5 + 1);
          pTVar8 = (TestNode *)&pTVar8->m_name;
        } while ((ulong)uVar5 < (anon_struct_24_3_7bec94c7 *)0x2);
        paVar11 = (anon_struct_16_2_3f8b7511_conflict *)((long)&local_1b8->name + 1);
      } while (paVar11 != (anon_struct_16_2_3f8b7511_conflict *)0x3);
      lVar14 = (long)local_210 + 1;
    } while (lVar14 != 4);
    tcu::TestNode::addChild(local_238,(TestNode *)local_1d8.field_2._M_allocated_capacity);
    lVar14 = (long)local_208 + 1;
    if (lVar14 == 3) {
      lVar14 = 0;
      do {
        util::Texture2DTestCaseParameters::Texture2DTestCaseParameters
                  ((Texture2DTestCaseParameters *)local_2a0);
        pcStack_258 = (char *)0x0;
        local_260 = COORDTYPE_BASIC_BIAS;
        local_2a0._8_4_ =
             *(FilterMode *)((long)&populateTextureMipmappingTests::minFilterModes[0].mode + lVar14)
        ;
        local_2a0._16_4_ = COORDTYPE_AFFINE;
        local_2a0._20_4_ = COORDTYPE_AFFINE;
        local_2a0._24_4_ = VK_FORMAT_R8G8B8A8_UNORM;
        local_268 = (pointer)0x4000000040;
        local_1b0._0_4_ = VK_SAMPLE_COUNT_4_BIT;
        local_2a0._12_4_ = local_2a0._8_4_;
        if (local_2a0._40_8_ == local_2a0._48_8_) {
          std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
          _M_realloc_insert<vkt::texture::util::Program>
                    ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                      *)(local_2a0 + 0x20),(iterator)local_2a0._40_8_,(Program *)local_1b0);
        }
        else {
          *(Program *)local_2a0._40_8_ = PROGRAM_2D_FLOAT_BIAS;
          local_2a0._40_8_ = local_2a0._40_8_ + 4;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
        pcVar2 = *(char **)((long)&populateTextureMipmappingTests::minFilterModes[0].name + lVar14);
        if (pcVar2 == (char *)0x0) {
          std::ios::clear((int)auStack_2e8 +
                          (int)*(undefined8 *)(CONCAT44(local_1b0._4_4_,local_1b0._0_4_) + -0x18) +
                          0x138);
        }
        else {
          sVar6 = strlen(pcVar2);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,pcVar2,sVar6);
        }
        pTVar7 = (TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DMipmapTestInstance>
                  *)operator_new(0xc0);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2e0,(char *)local_230[0],(allocator<char> *)(local_2d0 + 0x1f));
        local_1e8[0] = &local_1d8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"","");
        util::TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DMipmapTestInstance>::
        TextureTestCase(pTVar7,(TestContext *)local_2d0._16_8_,local_2e0[0],local_1e8[0],
                        (ParameterType *)local_2a0);
        tcu::TestNode::addChild(local_240,(TestNode *)pTVar7);
        if (local_1e8[0] != &local_1d8) {
          operator_delete(local_1e8[0],(ulong)(local_1d8._M_dataplus._M_p + 1));
        }
        if (local_2e0[0] != (string *)local_2d0) {
          operator_delete(local_2e0[0],(ulong)(local_2d0._0_8_ + 1));
        }
        if (local_230[0] != local_220) {
          operator_delete(local_230[0],local_220[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
        std::ios_base::~ios_base(local_140);
        if ((pointer)local_2a0._32_8_ != (pointer)0x0) {
          operator_delete((void *)local_2a0._32_8_,local_2a0._48_8_ - local_2a0._32_8_);
        }
        lVar14 = lVar14 + 0x10;
      } while (lVar14 != 0x40);
      lVar14 = 0;
      do {
        util::Texture2DTestCaseParameters::Texture2DTestCaseParameters
                  ((Texture2DTestCaseParameters *)local_1b0);
        local_1b0._64_8_ = local_1b0._64_8_ & 0xffffffff00000000;
        pcStack_168 = (char *)0x0;
        local_1b0._8_4_ =
             *(FilterMode *)((long)&populateTextureMipmappingTests::minFilterModes[0].mode + lVar14)
        ;
        local_2a0._0_4_ = 0;
        if (local_1b0._40_8_ == local_1b0._48_8_) {
          std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
          _M_realloc_insert<vkt::texture::util::Program>
                    ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                      *)(local_1b0 + 0x20),(iterator)local_1b0._40_8_,(Program *)local_2a0);
        }
        else {
          *(Program *)local_1b0._40_8_ = PROGRAM_2D_FLOAT;
          local_1b0._40_8_ = local_1b0._40_8_ + 4;
        }
        pTVar8 = (TestNode *)operator_new(0xc0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2a0,
                   *(char **)((long)&populateTextureMipmappingTests::minFilterModes[0].name + lVar14
                             ),(allocator<char> *)local_230);
        local_2e0[0] = (string *)local_2d0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"","");
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar8,(TestContext *)local_2d0._16_8_,
                   (char *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_),(char *)local_2e0[0]);
        pTVar8->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00d03308;
        pTVar8[1]._vptr_TestNode = (_func_int **)CONCAT44(local_1b0._4_4_,local_1b0._0_4_);
        pTVar8[1].m_testCtx = (TestContext *)CONCAT44(local_1b0._12_4_,local_1b0._8_4_);
        *(ulong *)((long)&pTVar8[1].m_testCtx + 4) = CONCAT44(local_1b0._16_4_,local_1b0._12_4_);
        *(ulong *)((long)&pTVar8[1].m_name._M_dataplus._M_p + 4) =
             CONCAT44(local_1b0._24_4_,local_1b0._20_4_);
        std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
        vector((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               &pTVar8[1].m_name.field_2,
               (vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               (local_1b0 + 0x20));
        pTVar8[1].m_description._M_string_length = local_1b0._56_8_;
        pTVar8[1].m_description.field_2._M_allocated_capacity = local_1b0._64_8_;
        *(char **)((long)&pTVar8[1].m_description.field_2 + 8) = pcStack_168;
        tcu::TestNode::addChild(local_248,pTVar8);
        if (local_2e0[0] != (string *)local_2d0) {
          operator_delete(local_2e0[0],(ulong)(local_2d0._0_8_ + 1));
        }
        if ((undefined1 *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_) != local_2a0 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_),
                          CONCAT44(local_2a0._20_4_,local_2a0._16_4_) + 1);
        }
        if ((pointer)local_1b0._32_8_ != (pointer)0x0) {
          operator_delete((void *)local_1b0._32_8_,local_1b0._48_8_ - local_1b0._32_8_);
        }
        lVar14 = lVar14 + 0x10;
      } while (lVar14 != 0x40);
      lVar14 = 0;
      do {
        util::Texture2DTestCaseParameters::Texture2DTestCaseParameters
                  ((Texture2DTestCaseParameters *)local_1b0);
        local_1b0._64_8_ = local_1b0._64_8_ & 0xffffffff00000000;
        pcStack_168 = (char *)0x0;
        local_1b0._8_4_ =
             *(FilterMode *)((long)&populateTextureMipmappingTests::minFilterModes[0].mode + lVar14)
        ;
        local_2a0._0_4_ = 0;
        if (local_1b0._40_8_ == local_1b0._48_8_) {
          std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
          _M_realloc_insert<vkt::texture::util::Program>
                    ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                      *)(local_1b0 + 0x20),(iterator)local_1b0._40_8_,(Program *)local_2a0);
        }
        else {
          *(Program *)local_1b0._40_8_ = PROGRAM_2D_FLOAT;
          local_1b0._40_8_ = local_1b0._40_8_ + 4;
        }
        pTVar8 = (TestNode *)operator_new(0xc0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2a0,
                   *(char **)((long)&populateTextureMipmappingTests::minFilterModes[0].name + lVar14
                             ),(allocator<char> *)local_230);
        local_2e0[0] = (string *)local_2d0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"","");
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar8,(TestContext *)local_2d0._16_8_,
                   (char *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_),(char *)local_2e0[0]);
        pTVar8->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00d033f8;
        pTVar8[1]._vptr_TestNode = (_func_int **)CONCAT44(local_1b0._4_4_,local_1b0._0_4_);
        pTVar8[1].m_testCtx = (TestContext *)CONCAT44(local_1b0._12_4_,local_1b0._8_4_);
        *(ulong *)((long)&pTVar8[1].m_testCtx + 4) = CONCAT44(local_1b0._16_4_,local_1b0._12_4_);
        *(ulong *)((long)&pTVar8[1].m_name._M_dataplus._M_p + 4) =
             CONCAT44(local_1b0._24_4_,local_1b0._20_4_);
        std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
        vector((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               &pTVar8[1].m_name.field_2,
               (vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               (local_1b0 + 0x20));
        pTVar8[1].m_description._M_string_length = local_1b0._56_8_;
        pTVar8[1].m_description.field_2._M_allocated_capacity = local_1b0._64_8_;
        *(char **)((long)&pTVar8[1].m_description.field_2 + 8) = pcStack_168;
        tcu::TestNode::addChild(local_2b0,pTVar8);
        if (local_2e0[0] != (string *)local_2d0) {
          operator_delete(local_2e0[0],(ulong)(local_2d0._0_8_ + 1));
        }
        if ((undefined1 *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_) != local_2a0 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_),
                          CONCAT44(local_2a0._20_4_,local_2a0._16_4_) + 1);
        }
        if ((pointer)local_1b0._32_8_ != (pointer)0x0) {
          operator_delete((void *)local_1b0._32_8_,local_1b0._48_8_ - local_1b0._32_8_);
        }
        lVar14 = lVar14 + 0x10;
      } while (lVar14 != 0x40);
      lVar14 = 0;
      do {
        util::Texture2DTestCaseParameters::Texture2DTestCaseParameters
                  ((Texture2DTestCaseParameters *)local_1b0);
        local_1b0._64_8_ = local_1b0._64_8_ & 0xffffffff00000000;
        local_1b0._8_4_ =
             *(FilterMode *)((long)&populateTextureMipmappingTests::minFilterModes[0].mode + lVar14)
        ;
        pcVar2 = *(char **)((long)&populateTextureMipmappingTests::minFilterModes[0].name + lVar14);
        local_2a0._0_4_ = 0;
        pcStack_168 = pcVar2;
        if (local_1b0._40_8_ == local_1b0._48_8_) {
          std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
          _M_realloc_insert<vkt::texture::util::Program>
                    ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                      *)(local_1b0 + 0x20),(iterator)local_1b0._40_8_,(Program *)local_2a0);
        }
        else {
          *(Program *)local_1b0._40_8_ = PROGRAM_2D_FLOAT;
          local_1b0._40_8_ = local_1b0._40_8_ + 4;
        }
        pTVar8 = (TestNode *)operator_new(0xc0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2a0,pcVar2,(allocator<char> *)local_230);
        local_2e0[0] = (string *)local_2d0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"","");
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar8,(TestContext *)local_2d0._16_8_,
                   (char *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_),(char *)local_2e0[0]);
        pTVar8->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00d034a0;
        pTVar8[1]._vptr_TestNode = (_func_int **)CONCAT44(local_1b0._4_4_,local_1b0._0_4_);
        pTVar8[1].m_testCtx = (TestContext *)CONCAT44(local_1b0._12_4_,local_1b0._8_4_);
        *(ulong *)((long)&pTVar8[1].m_testCtx + 4) = CONCAT44(local_1b0._16_4_,local_1b0._12_4_);
        *(ulong *)((long)&pTVar8[1].m_name._M_dataplus._M_p + 4) =
             CONCAT44(local_1b0._24_4_,local_1b0._20_4_);
        std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
        vector((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               &pTVar8[1].m_name.field_2,
               (vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               (local_1b0 + 0x20));
        pTVar8[1].m_description._M_string_length = local_1b0._56_8_;
        pTVar8[1].m_description.field_2._M_allocated_capacity = local_1b0._64_8_;
        *(char **)((long)&pTVar8[1].m_description.field_2 + 8) = pcStack_168;
        tcu::TestNode::addChild(local_2a8,pTVar8);
        if (local_2e0[0] != (string *)local_2d0) {
          operator_delete(local_2e0[0],(ulong)(local_2d0._0_8_ + 1));
        }
        if ((undefined1 *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_) != local_2a0 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_),
                          CONCAT44(local_2a0._20_4_,local_2a0._16_4_) + 1);
        }
        if ((pointer)local_1b0._32_8_ != (pointer)0x0) {
          operator_delete((void *)local_1b0._32_8_,local_1b0._48_8_ - local_1b0._32_8_);
        }
        lVar14 = lVar14 + 0x10;
      } while (lVar14 != 0x40);
      lVar14 = 0;
      do {
        util::Texture2DTestCaseParameters::Texture2DTestCaseParameters
                  ((Texture2DTestCaseParameters *)local_1b0);
        local_1b0._64_8_ = local_1b0._64_8_ & 0xffffffff00000000;
        local_1b0._8_4_ =
             *(FilterMode *)((long)&populateTextureMipmappingTests::minFilterModes[0].mode + lVar14)
        ;
        pcVar2 = *(char **)((long)&populateTextureMipmappingTests::minFilterModes[0].name + lVar14);
        local_2a0._0_4_ = 0;
        pcStack_168 = pcVar2;
        if (local_1b0._40_8_ == local_1b0._48_8_) {
          std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
          _M_realloc_insert<vkt::texture::util::Program>
                    ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                      *)(local_1b0 + 0x20),(iterator)local_1b0._40_8_,(Program *)local_2a0);
        }
        else {
          *(Program *)local_1b0._40_8_ = PROGRAM_2D_FLOAT;
          local_1b0._40_8_ = local_1b0._40_8_ + 4;
        }
        pTVar8 = (TestNode *)operator_new(0xc0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2a0,pcVar2,(allocator<char> *)local_230);
        local_2e0[0] = (string *)local_2d0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"","");
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar8,(TestContext *)local_2d0._16_8_,
                   (char *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_),(char *)local_2e0[0]);
        pTVar8->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00d03548;
        pTVar8[1]._vptr_TestNode = (_func_int **)CONCAT44(local_1b0._4_4_,local_1b0._0_4_);
        pTVar8[1].m_testCtx = (TestContext *)CONCAT44(local_1b0._12_4_,local_1b0._8_4_);
        *(ulong *)((long)&pTVar8[1].m_testCtx + 4) = CONCAT44(local_1b0._16_4_,local_1b0._12_4_);
        *(ulong *)((long)&pTVar8[1].m_name._M_dataplus._M_p + 4) =
             CONCAT44(local_1b0._24_4_,local_1b0._20_4_);
        std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
        vector((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               &pTVar8[1].m_name.field_2,
               (vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               (local_1b0 + 0x20));
        pTVar8[1].m_description._M_string_length = local_1b0._56_8_;
        pTVar8[1].m_description.field_2._M_allocated_capacity = local_1b0._64_8_;
        *(char **)((long)&pTVar8[1].m_description.field_2 + 8) = pcStack_168;
        tcu::TestNode::addChild(local_1f8,pTVar8);
        if (local_2e0[0] != (string *)local_2d0) {
          operator_delete(local_2e0[0],(ulong)(local_2d0._0_8_ + 1));
        }
        if ((undefined1 *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_) != local_2a0 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_),
                          CONCAT44(local_2a0._20_4_,local_2a0._16_4_) + 1);
        }
        if ((pointer)local_1b0._32_8_ != (pointer)0x0) {
          operator_delete((void *)local_1b0._32_8_,local_1b0._48_8_ - local_1b0._32_8_);
        }
        pTVar9 = local_238;
        pTVar8 = local_248;
        lVar14 = lVar14 + 0x10;
      } while (lVar14 != 0x40);
      tcu::TestNode::addChild(local_238,local_240);
      tcu::TestNode::addChild(pTVar9,pTVar8);
      pTVar8 = local_2b0;
      local_2b0 = (TestNode *)0x0;
      tcu::TestNode::addChild(pTVar9,pTVar8);
      pTVar8 = local_2a8;
      local_2b0 = (TestNode *)0x0;
      local_2a8 = (TestNode *)0x0;
      tcu::TestNode::addChild(pTVar9,pTVar8);
      tcu::TestNode::addChild(pTVar9,local_1f8);
      tcu::TestNode::addChild(local_38,pTVar9);
      local_208 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)local_208,(TestContext *)local_2d0._16_8_,"cubemap",
                 "Cube Mipmap Filtering");
      local_2b0 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)local_2b0,(TestContext *)local_2d0._16_8_,"min_lod",
                 "Lod control: min lod");
      local_2a8 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)local_2a8,(TestContext *)local_2d0._16_8_,"max_lod",
                 "Lod control: max lod");
      local_210 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)local_210,(TestContext *)local_2d0._16_8_,"base_level",
                 "Base level");
      local_238 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)local_238,(TestContext *)local_2d0._16_8_,"max_level","Max level")
      ;
      paVar11 = (anon_struct_16_2_3f8b7511_conflict *)0x0;
      do {
        local_200 = (TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DMipmapTestInstance>
                     *)operator_new(0x70);
        local_1b8 = paVar11;
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)local_200,(TestContext *)local_2d0._16_8_,
                   populateTextureMipmappingTests::cubeCoordTypes[(long)paVar11].name,
                   populateTextureMipmappingTests::cubeCoordTypes[(long)paVar11].desc);
        local_1d8.field_2._8_8_ = populateTextureMipmappingTests::cubeCoordTypes + (long)paVar11;
        pTVar8 = (TestNode *)0x0;
        do {
          local_1f0 = (TestNode *)CONCAT44(local_1f0._4_4_,0xd03101);
          lVar14 = 0;
          local_1d8.field_2._M_allocated_capacity = (size_type)pTVar8;
          do {
            lVar12 = 8;
            do {
              util::TextureCubeTestCaseParameters::TextureCubeTestCaseParameters
                        ((TextureCubeTestCaseParameters *)local_2a0);
              local_260 = *(CoordType *)local_1d8.field_2._8_8_;
              local_2a0._8_4_ = populateTextureMipmappingTests::minFilterModes[(long)pTVar8].mode;
              local_2a0._12_4_ = populateTextureMipmappingTests::magFilterModes[lVar14].mode;
              pcVar2 = populateTextureMipmappingTests::minFilterModes[(long)pTVar8].name;
              local_2a0._16_4_ =
                   *(CoordType *)((long)&populateTextureMipmappingTests::wrapModes[0].name + lVar12)
              ;
              local_2a0._24_4_ = VK_FORMAT_R8G8B8A8_UNORM;
              local_268 = (pointer)CONCAT44(local_268._4_4_,0x40);
              local_1b0._0_4_ = VK_SAMPLE_COUNT_16_BIT;
              local_2a0._20_4_ = local_2a0._16_4_;
              pcStack_258 = pcVar2;
              if (local_2a0._40_8_ == local_2a0._48_8_) {
                std::
                vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
                _M_realloc_insert<vkt::texture::util::Program>
                          ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                            *)(local_2a0 + 0x20),(iterator)local_2a0._40_8_,(Program *)local_1b0);
              }
              else {
                *(Program *)local_2a0._40_8_ = PROGRAM_CUBE_FLOAT;
                local_2a0._40_8_ = local_2a0._40_8_ + 4;
              }
              local_1b0._0_4_ = VK_SAMPLE_COUNT_16_BIT|VK_SAMPLE_COUNT_4_BIT;
              if (local_2a0._40_8_ == local_2a0._48_8_) {
                std::
                vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
                _M_realloc_insert<vkt::texture::util::Program>
                          ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                            *)(local_2a0 + 0x20),(iterator)local_2a0._40_8_,(Program *)local_1b0);
              }
              else {
                *(Program *)local_2a0._40_8_ = PROGRAM_CUBE_FLOAT_BIAS;
                local_2a0._40_8_ = local_2a0._40_8_ + 4;
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
              if (pcVar2 == (char *)0x0) {
                std::ios::clear((int)auStack_2e8 +
                                (int)*(undefined8 *)
                                      (CONCAT44(local_1b0._4_4_,local_1b0._0_4_) + -0x18) + 0x138);
              }
              else {
                sVar6 = strlen(pcVar2);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b0,pcVar2,sVar6);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"_",1);
              pcVar2 = populateTextureMipmappingTests::magFilterModes[lVar14].name;
              if (pcVar2 == (char *)0x0) {
                std::ios::clear((int)auStack_2e8 +
                                (int)*(undefined8 *)
                                      (CONCAT44(local_1b0._4_4_,local_1b0._0_4_) + -0x18) + 0x138);
              }
              else {
                sVar6 = strlen(pcVar2);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b0,pcVar2,sVar6);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"_",1);
              pcVar2 = *(char **)((long)&PTR_typeinfo_00d030c8 + lVar12);
              if (pcVar2 == (char *)0x0) {
                std::ios::clear((int)auStack_2e8 +
                                (int)*(undefined8 *)
                                      (CONCAT44(local_1b0._4_4_,local_1b0._0_4_) + -0x18) + 0x138);
              }
              else {
                sVar6 = strlen(pcVar2);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b0,pcVar2,sVar6);
              }
              pTVar9 = (TestNode *)operator_new(0xc0);
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_2e0,(char *)local_230[0],
                         (allocator<char> *)(local_2d0 + 0x1f));
              local_1e8[0] = &local_1d8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"");
              tcu::TestCase::TestCase
                        ((TestCase *)pTVar9,(TestContext *)local_2d0._16_8_,(char *)local_2e0[0],
                         (char *)local_1e8[0]);
              pTVar9->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00d035f0;
              pTVar9[1]._vptr_TestNode = (_func_int **)CONCAT44(local_2a0._4_4_,local_2a0._0_4_);
              pTVar9[1].m_testCtx = (TestContext *)CONCAT44(local_2a0._12_4_,local_2a0._8_4_);
              *(ulong *)((long)&pTVar9[1].m_testCtx + 4) =
                   CONCAT44(local_2a0._16_4_,local_2a0._12_4_);
              *(ulong *)((long)&pTVar9[1].m_name._M_dataplus._M_p + 4) =
                   CONCAT44(local_2a0._24_4_,local_2a0._20_4_);
              std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
              ::vector((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                        *)&pTVar9[1].m_name.field_2,
                       (vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                        *)(local_2a0 + 0x20));
              *(int *)&pTVar9[1].m_description._M_string_length = (int)local_268;
              pTVar9[1].m_description.field_2._M_allocated_capacity = CONCAT44(iStack_25c,local_260)
              ;
              *(char **)((long)&pTVar9[1].m_description.field_2 + 8) = pcStack_258;
              tcu::TestNode::addChild((TestNode *)local_200,pTVar9);
              if (local_1e8[0] != &local_1d8) {
                operator_delete(local_1e8[0],(ulong)(local_1d8._M_dataplus._M_p + 1));
              }
              if (local_2e0[0] != (string *)local_2d0) {
                operator_delete(local_2e0[0],(ulong)(local_2d0._0_8_ + 1));
              }
              if (local_230[0] != local_220) {
                operator_delete(local_230[0],local_220[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
              std::ios_base::~ios_base(local_140);
              if ((pointer)local_2a0._32_8_ != (pointer)0x0) {
                operator_delete((void *)local_2a0._32_8_,local_2a0._48_8_ - local_2a0._32_8_);
              }
              lVar12 = lVar12 + 0x10;
            } while (lVar12 != 0x38);
            lVar14 = 1;
            uVar4 = (ulong)local_1f0 & 1;
            local_1f0 = (TestNode *)((ulong)local_1f0 & 0xffffffff00000000);
          } while (uVar4 != 0);
          pTVar8 = (TestNode *)(local_1d8.field_2._M_allocated_capacity + 1);
        } while (pTVar8 != (TestNode *)0x4);
        tcu::TestNode::addChild(local_208,(TestNode *)local_200);
        paVar11 = (anon_struct_16_2_3f8b7511_conflict *)((long)&local_1b8->name + 1);
      } while (paVar11 != (anon_struct_16_2_3f8b7511_conflict *)0x3);
      lVar14 = 0;
      do {
        util::TextureCubeTestCaseParameters::TextureCubeTestCaseParameters
                  ((TextureCubeTestCaseParameters *)local_1b0);
        local_1b0._64_8_ = local_1b0._64_8_ & 0xffffffff00000000;
        pcStack_168 = (char *)0x0;
        local_1b0._8_4_ =
             *(FilterMode *)((long)&populateTextureMipmappingTests::minFilterModes[0].mode + lVar14)
        ;
        local_2a0._0_4_ = VK_SAMPLE_COUNT_16_BIT;
        if (local_1b0._40_8_ == local_1b0._48_8_) {
          std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
          _M_realloc_insert<vkt::texture::util::Program>
                    ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                      *)(local_1b0 + 0x20),(iterator)local_1b0._40_8_,(Program *)local_2a0);
        }
        else {
          *(Program *)local_1b0._40_8_ = PROGRAM_CUBE_FLOAT;
          local_1b0._40_8_ = local_1b0._40_8_ + 4;
        }
        pTVar8 = (TestNode *)operator_new(0xc0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2a0,
                   *(char **)((long)&populateTextureMipmappingTests::minFilterModes[0].name + lVar14
                             ),(allocator<char> *)local_230);
        local_2e0[0] = (string *)local_2d0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"","");
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar8,(TestContext *)local_2d0._16_8_,
                   (char *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_),(char *)local_2e0[0]);
        pTVar8->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00d03690;
        pTVar8[1]._vptr_TestNode = (_func_int **)CONCAT44(local_1b0._4_4_,local_1b0._0_4_);
        pTVar8[1].m_testCtx = (TestContext *)CONCAT44(local_1b0._12_4_,local_1b0._8_4_);
        *(ulong *)((long)&pTVar8[1].m_testCtx + 4) = CONCAT44(local_1b0._16_4_,local_1b0._12_4_);
        *(ulong *)((long)&pTVar8[1].m_name._M_dataplus._M_p + 4) =
             CONCAT44(local_1b0._24_4_,local_1b0._20_4_);
        std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
        vector((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               &pTVar8[1].m_name.field_2,
               (vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               (local_1b0 + 0x20));
        *(undefined4 *)&pTVar8[1].m_description._M_string_length = local_1b0._56_4_;
        pTVar8[1].m_description.field_2._M_allocated_capacity = local_1b0._64_8_;
        *(char **)((long)&pTVar8[1].m_description.field_2 + 8) = pcStack_168;
        tcu::TestNode::addChild(local_2b0,pTVar8);
        if (local_2e0[0] != (string *)local_2d0) {
          operator_delete(local_2e0[0],(ulong)(local_2d0._0_8_ + 1));
        }
        if ((undefined1 *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_) != local_2a0 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_),
                          CONCAT44(local_2a0._20_4_,local_2a0._16_4_) + 1);
        }
        if ((pointer)local_1b0._32_8_ != (pointer)0x0) {
          operator_delete((void *)local_1b0._32_8_,local_1b0._48_8_ - local_1b0._32_8_);
        }
        lVar14 = lVar14 + 0x10;
      } while (lVar14 != 0x40);
      lVar14 = 0;
      do {
        util::TextureCubeTestCaseParameters::TextureCubeTestCaseParameters
                  ((TextureCubeTestCaseParameters *)local_1b0);
        local_1b0._64_8_ = local_1b0._64_8_ & 0xffffffff00000000;
        pcStack_168 = (char *)0x0;
        local_1b0._8_4_ =
             *(FilterMode *)((long)&populateTextureMipmappingTests::minFilterModes[0].mode + lVar14)
        ;
        local_2a0._0_4_ = VK_SAMPLE_COUNT_16_BIT;
        if (local_1b0._40_8_ == local_1b0._48_8_) {
          std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
          _M_realloc_insert<vkt::texture::util::Program>
                    ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                      *)(local_1b0 + 0x20),(iterator)local_1b0._40_8_,(Program *)local_2a0);
        }
        else {
          *(Program *)local_1b0._40_8_ = PROGRAM_CUBE_FLOAT;
          local_1b0._40_8_ = local_1b0._40_8_ + 4;
        }
        pTVar8 = (TestNode *)operator_new(0xc0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2a0,
                   *(char **)((long)&populateTextureMipmappingTests::minFilterModes[0].name + lVar14
                             ),(allocator<char> *)local_230);
        local_2e0[0] = (string *)local_2d0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"","");
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar8,(TestContext *)local_2d0._16_8_,
                   (char *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_),(char *)local_2e0[0]);
        pTVar8->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00d03780;
        pTVar8[1]._vptr_TestNode = (_func_int **)CONCAT44(local_1b0._4_4_,local_1b0._0_4_);
        pTVar8[1].m_testCtx = (TestContext *)CONCAT44(local_1b0._12_4_,local_1b0._8_4_);
        *(ulong *)((long)&pTVar8[1].m_testCtx + 4) = CONCAT44(local_1b0._16_4_,local_1b0._12_4_);
        *(ulong *)((long)&pTVar8[1].m_name._M_dataplus._M_p + 4) =
             CONCAT44(local_1b0._24_4_,local_1b0._20_4_);
        std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
        vector((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               &pTVar8[1].m_name.field_2,
               (vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               (local_1b0 + 0x20));
        *(undefined4 *)&pTVar8[1].m_description._M_string_length = local_1b0._56_4_;
        pTVar8[1].m_description.field_2._M_allocated_capacity = local_1b0._64_8_;
        *(char **)((long)&pTVar8[1].m_description.field_2 + 8) = pcStack_168;
        tcu::TestNode::addChild(local_2a8,pTVar8);
        if (local_2e0[0] != (string *)local_2d0) {
          operator_delete(local_2e0[0],(ulong)(local_2d0._0_8_ + 1));
        }
        if ((undefined1 *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_) != local_2a0 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_),
                          CONCAT44(local_2a0._20_4_,local_2a0._16_4_) + 1);
        }
        if ((pointer)local_1b0._32_8_ != (pointer)0x0) {
          operator_delete((void *)local_1b0._32_8_,local_1b0._48_8_ - local_1b0._32_8_);
        }
        lVar14 = lVar14 + 0x10;
      } while (lVar14 != 0x40);
      lVar14 = 0;
      do {
        util::TextureCubeTestCaseParameters::TextureCubeTestCaseParameters
                  ((TextureCubeTestCaseParameters *)local_1b0);
        local_1b0._64_8_ = local_1b0._64_8_ & 0xffffffff00000000;
        local_1b0._8_4_ =
             *(FilterMode *)((long)&populateTextureMipmappingTests::minFilterModes[0].mode + lVar14)
        ;
        pcVar2 = *(char **)((long)&populateTextureMipmappingTests::minFilterModes[0].name + lVar14);
        local_2a0._0_4_ = VK_SAMPLE_COUNT_16_BIT;
        pcStack_168 = pcVar2;
        if (local_1b0._40_8_ == local_1b0._48_8_) {
          std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
          _M_realloc_insert<vkt::texture::util::Program>
                    ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                      *)(local_1b0 + 0x20),(iterator)local_1b0._40_8_,(Program *)local_2a0);
        }
        else {
          *(Program *)local_1b0._40_8_ = PROGRAM_CUBE_FLOAT;
          local_1b0._40_8_ = local_1b0._40_8_ + 4;
        }
        pTVar8 = (TestNode *)operator_new(0xc0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2a0,pcVar2,(allocator<char> *)local_230);
        local_2e0[0] = (string *)local_2d0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"","");
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar8,(TestContext *)local_2d0._16_8_,
                   (char *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_),(char *)local_2e0[0]);
        pTVar8->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00d03828;
        pTVar8[1]._vptr_TestNode = (_func_int **)CONCAT44(local_1b0._4_4_,local_1b0._0_4_);
        pTVar8[1].m_testCtx = (TestContext *)CONCAT44(local_1b0._12_4_,local_1b0._8_4_);
        *(ulong *)((long)&pTVar8[1].m_testCtx + 4) = CONCAT44(local_1b0._16_4_,local_1b0._12_4_);
        *(ulong *)((long)&pTVar8[1].m_name._M_dataplus._M_p + 4) =
             CONCAT44(local_1b0._24_4_,local_1b0._20_4_);
        std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
        vector((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               &pTVar8[1].m_name.field_2,
               (vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               (local_1b0 + 0x20));
        *(undefined4 *)&pTVar8[1].m_description._M_string_length = local_1b0._56_4_;
        pTVar8[1].m_description.field_2._M_allocated_capacity = local_1b0._64_8_;
        *(char **)((long)&pTVar8[1].m_description.field_2 + 8) = pcStack_168;
        tcu::TestNode::addChild(local_210,pTVar8);
        if (local_2e0[0] != (string *)local_2d0) {
          operator_delete(local_2e0[0],(ulong)(local_2d0._0_8_ + 1));
        }
        if ((undefined1 *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_) != local_2a0 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_),
                          CONCAT44(local_2a0._20_4_,local_2a0._16_4_) + 1);
        }
        if ((pointer)local_1b0._32_8_ != (pointer)0x0) {
          operator_delete((void *)local_1b0._32_8_,local_1b0._48_8_ - local_1b0._32_8_);
        }
        lVar14 = lVar14 + 0x10;
      } while (lVar14 != 0x40);
      lVar14 = 0;
      do {
        util::TextureCubeTestCaseParameters::TextureCubeTestCaseParameters
                  ((TextureCubeTestCaseParameters *)local_1b0);
        local_1b0._64_8_ = local_1b0._64_8_ & 0xffffffff00000000;
        local_1b0._8_4_ =
             *(FilterMode *)((long)&populateTextureMipmappingTests::minFilterModes[0].mode + lVar14)
        ;
        pcVar2 = *(char **)((long)&populateTextureMipmappingTests::minFilterModes[0].name + lVar14);
        local_2a0._0_4_ = VK_SAMPLE_COUNT_16_BIT;
        pcStack_168 = pcVar2;
        if (local_1b0._40_8_ == local_1b0._48_8_) {
          std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
          _M_realloc_insert<vkt::texture::util::Program>
                    ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                      *)(local_1b0 + 0x20),(iterator)local_1b0._40_8_,(Program *)local_2a0);
        }
        else {
          *(Program *)local_1b0._40_8_ = PROGRAM_CUBE_FLOAT;
          local_1b0._40_8_ = local_1b0._40_8_ + 4;
        }
        pTVar8 = (TestNode *)operator_new(0xc0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2a0,pcVar2,(allocator<char> *)local_230);
        local_2e0[0] = (string *)local_2d0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"","");
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar8,(TestContext *)local_2d0._16_8_,
                   (char *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_),(char *)local_2e0[0]);
        pTVar8->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00d038d0;
        pTVar8[1]._vptr_TestNode = (_func_int **)CONCAT44(local_1b0._4_4_,local_1b0._0_4_);
        pTVar8[1].m_testCtx = (TestContext *)CONCAT44(local_1b0._12_4_,local_1b0._8_4_);
        *(ulong *)((long)&pTVar8[1].m_testCtx + 4) = CONCAT44(local_1b0._16_4_,local_1b0._12_4_);
        *(ulong *)((long)&pTVar8[1].m_name._M_dataplus._M_p + 4) =
             CONCAT44(local_1b0._24_4_,local_1b0._20_4_);
        std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
        vector((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               &pTVar8[1].m_name.field_2,
               (vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               (local_1b0 + 0x20));
        *(undefined4 *)&pTVar8[1].m_description._M_string_length = local_1b0._56_4_;
        pTVar8[1].m_description.field_2._M_allocated_capacity = local_1b0._64_8_;
        *(char **)((long)&pTVar8[1].m_description.field_2 + 8) = pcStack_168;
        tcu::TestNode::addChild(local_238,pTVar8);
        if (local_2e0[0] != (string *)local_2d0) {
          operator_delete(local_2e0[0],(ulong)(local_2d0._0_8_ + 1));
        }
        if ((undefined1 *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_) != local_2a0 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_),
                          CONCAT44(local_2a0._20_4_,local_2a0._16_4_) + 1);
        }
        if ((pointer)local_1b0._32_8_ != (pointer)0x0) {
          operator_delete((void *)local_1b0._32_8_,local_1b0._48_8_ - local_1b0._32_8_);
        }
        pTVar9 = local_208;
        pTVar8 = local_2a8;
        lVar14 = lVar14 + 0x10;
      } while (lVar14 != 0x40);
      tcu::TestNode::addChild(local_208,local_2b0);
      tcu::TestNode::addChild(pTVar9,pTVar8);
      pTVar8 = local_210;
      local_210 = (TestNode *)0x0;
      tcu::TestNode::addChild(pTVar9,pTVar8);
      tcu::TestNode::addChild(pTVar9,local_238);
      tcu::TestNode::addChild(local_38,pTVar9);
      local_238 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)local_238,(TestContext *)local_2d0._16_8_,"3d",
                 "3D Mipmap Filtering");
      local_240 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)local_240,(TestContext *)local_2d0._16_8_,"bias",
                 "User-supplied bias value");
      local_248 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)local_248,(TestContext *)local_2d0._16_8_,"min_lod",
                 "Lod control: min lod");
      local_2b0 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)local_2b0,(TestContext *)local_2d0._16_8_,"max_lod",
                 "Lod control: max lod");
      local_2a8 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)local_2a8,(TestContext *)local_2d0._16_8_,"base_level",
                 "Base level");
      local_1f8 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)local_1f8,(TestContext *)local_2d0._16_8_,"max_level","Max level")
      ;
      local_208 = (TestNode *)0x0;
      do {
        local_1f0 = (TestNode *)operator_new(0x70);
        pTVar8 = local_208;
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)local_1f0,(TestContext *)local_2d0._16_8_,
                   populateTextureMipmappingTests::coordTypes[(long)local_208].name,
                   populateTextureMipmappingTests::coordTypes[(long)local_208].desc);
        local_1d8.field_2._8_4_ = populateTextureMipmappingTests::coordTypes[(long)pTVar8].type;
        lVar14 = 0;
        do {
          local_1b8 = populateTextureMipmappingTests::minFilterModes + lVar14;
          pTVar8 = (TestNode *)0x0;
          local_210 = (TestNode *)lVar14;
          do {
            util::Texture3DTestCaseParameters::Texture3DTestCaseParameters
                      ((Texture3DTestCaseParameters *)local_2a0);
            pcStack_258 = (char *)CONCAT44(pcStack_258._4_4_,local_1d8.field_2._8_4_);
            local_2a0._8_4_ = local_1b8->mode;
            pcVar2 = local_1b8->name;
            local_200 = (TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DMipmapTestInstance>
                         *)((long)pTVar8 * 0x10);
            local_2a0._16_4_ = populateTextureMipmappingTests::wrapModes[(long)pTVar8].mode;
            local_2a0._24_4_ = VK_FORMAT_R8G8B8A8_UNORM;
            local_1b0._0_4_ = VK_SAMPLE_COUNT_32_BIT;
            local_2a0._20_4_ = local_2a0._16_4_;
            local_260 = local_2a0._16_4_;
            local_250 = pcVar2;
            local_1d8.field_2._M_allocated_capacity = (size_type)pTVar8;
            if (local_2a0._40_8_ == local_2a0._48_8_) {
              std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
              ::_M_realloc_insert<vkt::texture::util::Program>
                        ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                          *)(local_2a0 + 0x20),(iterator)local_2a0._40_8_,(Program *)local_1b0);
            }
            else {
              *(Program *)local_2a0._40_8_ = PROGRAM_3D_FLOAT;
              local_2a0._40_8_ = local_2a0._40_8_ + 4;
            }
            local_200 = (TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DMipmapTestInstance>
                         *)((long)&populateTextureMipmappingTests::wrapModes[0].name +
                           (long)local_200);
            piVar13 = &populateTextureMipmappingTests::tex3DSizes[0].depth;
            iVar16 = 0;
            do {
              local_268 = *(pointer *)(piVar13 + -2);
              iStack_25c = *piVar13;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
              if (pcVar2 == (char *)0x0) {
                std::ios::clear((int)auStack_2e8 +
                                (int)*(undefined8 *)
                                      (CONCAT44(local_1b0._4_4_,local_1b0._0_4_) + -0x18) + 0x138);
              }
              else {
                sVar6 = strlen(pcVar2);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b0,pcVar2,sVar6);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"_",1);
              __s_00 = (local_200->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode;
              if (__s_00 == (_func_int **)0x0) {
                std::ios::clear((int)auStack_2e8 +
                                (int)*(undefined8 *)
                                      (CONCAT44(local_1b0._4_4_,local_1b0._0_4_) + -0x18) + 0x138);
              }
              else {
                sVar6 = strlen((char *)__s_00);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b0,(char *)__s_00,sVar6);
              }
              __s_01 = ((anon_struct_24_4_abf30936 *)(piVar13 + -4))->name;
              if (__s_01 != (char *)0x0) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b0,"_",1);
                sVar6 = strlen(__s_01);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b0,__s_01,sVar6);
              }
              pTVar10 = (TextureTestCase<vkt::texture::(anonymous_namespace)::Texture3DMipmapTestInstance>
                         *)operator_new(200);
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_2e0,(char *)local_230[0],
                         (allocator<char> *)(local_2d0 + 0x1f));
              local_1e8[0] = &local_1d8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"");
              util::
              TextureTestCase<vkt::texture::(anonymous_namespace)::Texture3DMipmapTestInstance>::
              TextureTestCase(pTVar10,(TestContext *)local_2d0._16_8_,local_2e0[0],local_1e8[0],
                              (ParameterType *)local_2a0);
              tcu::TestNode::addChild(local_1f0,(TestNode *)pTVar10);
              if (local_1e8[0] != &local_1d8) {
                operator_delete(local_1e8[0],(ulong)(local_1d8._M_dataplus._M_p + 1));
              }
              if (local_2e0[0] != (string *)local_2d0) {
                operator_delete(local_2e0[0],(ulong)(local_2d0._0_8_ + 1));
              }
              if (local_230[0] != local_220) {
                operator_delete(local_230[0],local_220[0] + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
              std::ios_base::~ios_base(local_140);
              piVar13 = piVar13 + 6;
              bVar3 = iVar16 == 0;
              iVar16 = iVar16 + 1;
            } while (bVar3 && local_1d8.field_2._8_4_ == 0);
            if ((pointer)local_2a0._32_8_ != (pointer)0x0) {
              operator_delete((void *)local_2a0._32_8_,local_2a0._48_8_ - local_2a0._32_8_);
            }
            pTVar8 = (TestNode *)(local_1d8.field_2._M_allocated_capacity + 1);
          } while (pTVar8 != (TestNode *)0x3);
          lVar14 = (long)local_210 + 1;
        } while (lVar14 != 4);
        tcu::TestNode::addChild(local_238,local_1f0);
        local_208 = (TestNode *)((long)local_208 + 1);
      } while (local_208 != (TestNode *)0x3);
      lVar14 = 0;
      local_208 = (TestNode *)0x3;
      do {
        util::Texture3DTestCaseParameters::Texture3DTestCaseParameters
                  ((Texture3DTestCaseParameters *)local_1b0);
        pcStack_160 = (char *)0x0;
        pcStack_168 = (char *)CONCAT44(pcStack_168._4_4_,1);
        local_1b0._8_4_ =
             *(FilterMode *)((long)&populateTextureMipmappingTests::minFilterModes[0].mode + lVar14)
        ;
        local_1b0._16_4_ = REPEAT_GL;
        local_1b0._20_4_ = REPEAT_GL;
        local_1b0._24_4_ = VK_FORMAT_R8G8B8A8_UNORM;
        local_1b0._56_8_ = 0x2000000020;
        local_1b0._64_8_ = 0x2000000002;
        local_2a0._0_4_ = VK_SAMPLE_COUNT_32_BIT;
        if (local_1b0._40_8_ == local_1b0._48_8_) {
          std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
          _M_realloc_insert<vkt::texture::util::Program>
                    ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                      *)(local_1b0 + 0x20),(iterator)local_1b0._40_8_,(Program *)local_2a0);
        }
        else {
          *(Program *)local_1b0._40_8_ = PROGRAM_3D_FLOAT;
          local_1b0._40_8_ = local_1b0._40_8_ + 4;
        }
        local_2a0._0_4_ = VK_SAMPLE_COUNT_32_BIT|VK_SAMPLE_COUNT_2_BIT|VK_SAMPLE_COUNT_1_BIT;
        if (local_1b0._40_8_ == local_1b0._48_8_) {
          std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
          _M_realloc_insert<vkt::texture::util::Program>
                    ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                      *)(local_1b0 + 0x20),(iterator)local_1b0._40_8_,(Program *)local_2a0);
        }
        else {
          *(Program *)local_1b0._40_8_ = PROGRAM_3D_FLOAT_BIAS;
          local_1b0._40_8_ = local_1b0._40_8_ + 4;
        }
        pTVar10 = (TextureTestCase<vkt::texture::(anonymous_namespace)::Texture3DMipmapTestInstance>
                   *)operator_new(200);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2a0,
                   *(char **)((long)&populateTextureMipmappingTests::minFilterModes[0].name + lVar14
                             ),(allocator<char> *)local_230);
        local_2e0[0] = (string *)local_2d0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"","");
        util::TextureTestCase<vkt::texture::(anonymous_namespace)::Texture3DMipmapTestInstance>::
        TextureTestCase(pTVar10,(TestContext *)local_2d0._16_8_,
                        (string *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_),local_2e0[0],
                        (ParameterType *)local_1b0);
        tcu::TestNode::addChild(local_240,(TestNode *)pTVar10);
        if (local_2e0[0] != (string *)local_2d0) {
          operator_delete(local_2e0[0],(ulong)(local_2d0._0_8_ + 1));
        }
        if ((undefined1 *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_) != local_2a0 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_),
                          CONCAT44(local_2a0._20_4_,local_2a0._16_4_) + 1);
        }
        if ((pointer)local_1b0._32_8_ != (pointer)0x0) {
          operator_delete((void *)local_1b0._32_8_,local_1b0._48_8_ - local_1b0._32_8_);
        }
        lVar14 = lVar14 + 0x10;
      } while (lVar14 != 0x40);
      lVar14 = 0;
      do {
        util::Texture3DTestCaseParameters::Texture3DTestCaseParameters
                  ((Texture3DTestCaseParameters *)local_1b0);
        pcStack_168 = (char *)((ulong)pcStack_168 & 0xffffffff00000000);
        pcStack_160 = (char *)0x0;
        local_1b0._8_4_ =
             *(FilterMode *)((long)&populateTextureMipmappingTests::minFilterModes[0].mode + lVar14)
        ;
        local_2a0._0_4_ = VK_SAMPLE_COUNT_32_BIT;
        if (local_1b0._40_8_ == local_1b0._48_8_) {
          std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
          _M_realloc_insert<vkt::texture::util::Program>
                    ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                      *)(local_1b0 + 0x20),(iterator)local_1b0._40_8_,(Program *)local_2a0);
        }
        else {
          *(Program *)local_1b0._40_8_ = PROGRAM_3D_FLOAT;
          local_1b0._40_8_ = local_1b0._40_8_ + 4;
        }
        pTVar8 = (TestNode *)operator_new(200);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2a0,
                   *(char **)((long)&populateTextureMipmappingTests::minFilterModes[0].name + lVar14
                             ),(allocator<char> *)local_230);
        local_2e0[0] = (string *)local_2d0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"","");
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar8,(TestContext *)local_2d0._16_8_,
                   (char *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_),(char *)local_2e0[0]);
        pTVar8->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00d03a18;
        pTVar8[1]._vptr_TestNode = (_func_int **)CONCAT44(local_1b0._4_4_,local_1b0._0_4_);
        pTVar8[1].m_testCtx = (TestContext *)CONCAT44(local_1b0._12_4_,local_1b0._8_4_);
        *(ulong *)((long)&pTVar8[1].m_testCtx + 4) = CONCAT44(local_1b0._16_4_,local_1b0._12_4_);
        *(ulong *)((long)&pTVar8[1].m_name._M_dataplus._M_p + 4) =
             CONCAT44(local_1b0._24_4_,local_1b0._20_4_);
        std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
        vector((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               &pTVar8[1].m_name.field_2,
               (vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               (local_1b0 + 0x20));
        pTVar8[1].m_description._M_string_length = local_1b0._56_8_;
        pTVar8[1].m_description.field_2._M_allocated_capacity = local_1b0._64_8_;
        *(char **)((long)&pTVar8[1].m_description.field_2 + 8) = pcStack_168;
        *(char **)&pTVar8[1].m_nodeType = pcStack_160;
        tcu::TestNode::addChild(local_248,pTVar8);
        if (local_2e0[0] != (string *)local_2d0) {
          operator_delete(local_2e0[0],(ulong)(local_2d0._0_8_ + 1));
        }
        if ((undefined1 *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_) != local_2a0 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_),
                          CONCAT44(local_2a0._20_4_,local_2a0._16_4_) + 1);
        }
        if ((pointer)local_1b0._32_8_ != (pointer)0x0) {
          operator_delete((void *)local_1b0._32_8_,local_1b0._48_8_ - local_1b0._32_8_);
        }
        lVar14 = lVar14 + 0x10;
      } while (lVar14 != 0x40);
      lVar14 = 0;
      do {
        util::Texture3DTestCaseParameters::Texture3DTestCaseParameters
                  ((Texture3DTestCaseParameters *)local_1b0);
        pcStack_168 = (char *)((ulong)pcStack_168 & 0xffffffff00000000);
        pcStack_160 = (char *)0x0;
        local_1b0._8_4_ =
             *(FilterMode *)((long)&populateTextureMipmappingTests::minFilterModes[0].mode + lVar14)
        ;
        local_2a0._0_4_ = VK_SAMPLE_COUNT_32_BIT;
        if (local_1b0._40_8_ == local_1b0._48_8_) {
          std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
          _M_realloc_insert<vkt::texture::util::Program>
                    ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                      *)(local_1b0 + 0x20),(iterator)local_1b0._40_8_,(Program *)local_2a0);
        }
        else {
          *(Program *)local_1b0._40_8_ = PROGRAM_3D_FLOAT;
          local_1b0._40_8_ = local_1b0._40_8_ + 4;
        }
        pTVar8 = (TestNode *)operator_new(200);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2a0,
                   *(char **)((long)&populateTextureMipmappingTests::minFilterModes[0].name + lVar14
                             ),(allocator<char> *)local_230);
        local_2e0[0] = (string *)local_2d0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"","");
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar8,(TestContext *)local_2d0._16_8_,
                   (char *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_),(char *)local_2e0[0]);
        pTVar8->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00d03b08;
        pTVar8[1]._vptr_TestNode = (_func_int **)CONCAT44(local_1b0._4_4_,local_1b0._0_4_);
        pTVar8[1].m_testCtx = (TestContext *)CONCAT44(local_1b0._12_4_,local_1b0._8_4_);
        *(ulong *)((long)&pTVar8[1].m_testCtx + 4) = CONCAT44(local_1b0._16_4_,local_1b0._12_4_);
        *(ulong *)((long)&pTVar8[1].m_name._M_dataplus._M_p + 4) =
             CONCAT44(local_1b0._24_4_,local_1b0._20_4_);
        std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
        vector((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               &pTVar8[1].m_name.field_2,
               (vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               (local_1b0 + 0x20));
        pTVar8[1].m_description._M_string_length = local_1b0._56_8_;
        pTVar8[1].m_description.field_2._M_allocated_capacity = local_1b0._64_8_;
        *(char **)((long)&pTVar8[1].m_description.field_2 + 8) = pcStack_168;
        *(char **)&pTVar8[1].m_nodeType = pcStack_160;
        tcu::TestNode::addChild(local_2b0,pTVar8);
        if (local_2e0[0] != (string *)local_2d0) {
          operator_delete(local_2e0[0],(ulong)(local_2d0._0_8_ + 1));
        }
        if ((undefined1 *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_) != local_2a0 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_),
                          CONCAT44(local_2a0._20_4_,local_2a0._16_4_) + 1);
        }
        if ((pointer)local_1b0._32_8_ != (pointer)0x0) {
          operator_delete((void *)local_1b0._32_8_,local_1b0._48_8_ - local_1b0._32_8_);
        }
        lVar14 = lVar14 + 0x10;
      } while (lVar14 != 0x40);
      lVar14 = 0;
      do {
        util::Texture3DTestCaseParameters::Texture3DTestCaseParameters
                  ((Texture3DTestCaseParameters *)local_1b0);
        pcStack_168 = (char *)((ulong)pcStack_168 & 0xffffffff00000000);
        local_1b0._8_4_ =
             *(FilterMode *)((long)&populateTextureMipmappingTests::minFilterModes[0].mode + lVar14)
        ;
        pcVar2 = *(char **)((long)&populateTextureMipmappingTests::minFilterModes[0].name + lVar14);
        local_2a0._0_4_ = VK_SAMPLE_COUNT_32_BIT;
        pcStack_160 = pcVar2;
        if (local_1b0._40_8_ == local_1b0._48_8_) {
          std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
          _M_realloc_insert<vkt::texture::util::Program>
                    ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                      *)(local_1b0 + 0x20),(iterator)local_1b0._40_8_,(Program *)local_2a0);
        }
        else {
          *(Program *)local_1b0._40_8_ = PROGRAM_3D_FLOAT;
          local_1b0._40_8_ = local_1b0._40_8_ + 4;
        }
        pTVar8 = (TestNode *)operator_new(200);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2a0,pcVar2,(allocator<char> *)local_230);
        local_2e0[0] = (string *)local_2d0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"","");
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar8,(TestContext *)local_2d0._16_8_,
                   (char *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_),(char *)local_2e0[0]);
        pTVar8->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00d03bb0;
        pTVar8[1]._vptr_TestNode = (_func_int **)CONCAT44(local_1b0._4_4_,local_1b0._0_4_);
        pTVar8[1].m_testCtx = (TestContext *)CONCAT44(local_1b0._12_4_,local_1b0._8_4_);
        *(ulong *)((long)&pTVar8[1].m_testCtx + 4) = CONCAT44(local_1b0._16_4_,local_1b0._12_4_);
        *(ulong *)((long)&pTVar8[1].m_name._M_dataplus._M_p + 4) =
             CONCAT44(local_1b0._24_4_,local_1b0._20_4_);
        std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
        vector((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               &pTVar8[1].m_name.field_2,
               (vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               (local_1b0 + 0x20));
        pTVar8[1].m_description._M_string_length = local_1b0._56_8_;
        pTVar8[1].m_description.field_2._M_allocated_capacity = local_1b0._64_8_;
        *(char **)((long)&pTVar8[1].m_description.field_2 + 8) = pcStack_168;
        *(char **)&pTVar8[1].m_nodeType = pcStack_160;
        tcu::TestNode::addChild(local_2a8,pTVar8);
        if (local_2e0[0] != (string *)local_2d0) {
          operator_delete(local_2e0[0],(ulong)(local_2d0._0_8_ + 1));
        }
        if ((undefined1 *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_) != local_2a0 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_),
                          CONCAT44(local_2a0._20_4_,local_2a0._16_4_) + 1);
        }
        if ((pointer)local_1b0._32_8_ != (pointer)0x0) {
          operator_delete((void *)local_1b0._32_8_,local_1b0._48_8_ - local_1b0._32_8_);
        }
        lVar14 = lVar14 + 0x10;
      } while (lVar14 != 0x40);
      lVar14 = 0;
      do {
        util::Texture3DTestCaseParameters::Texture3DTestCaseParameters
                  ((Texture3DTestCaseParameters *)local_1b0);
        pcStack_168 = (char *)((ulong)pcStack_168 & 0xffffffff00000000);
        local_1b0._8_4_ =
             *(FilterMode *)((long)&populateTextureMipmappingTests::minFilterModes[0].mode + lVar14)
        ;
        pcVar2 = *(char **)((long)&populateTextureMipmappingTests::minFilterModes[0].name + lVar14);
        local_2a0._0_4_ = VK_SAMPLE_COUNT_32_BIT;
        pcStack_160 = pcVar2;
        if (local_1b0._40_8_ == local_1b0._48_8_) {
          std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
          _M_realloc_insert<vkt::texture::util::Program>
                    ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                      *)(local_1b0 + 0x20),(iterator)local_1b0._40_8_,(Program *)local_2a0);
        }
        else {
          *(Program *)local_1b0._40_8_ = PROGRAM_3D_FLOAT;
          local_1b0._40_8_ = local_1b0._40_8_ + 4;
        }
        pTVar8 = (TestNode *)operator_new(200);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_2a0,pcVar2,(allocator<char> *)local_230);
        local_2e0[0] = (string *)local_2d0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"","");
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar8,(TestContext *)local_2d0._16_8_,
                   (char *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_),(char *)local_2e0[0]);
        pTVar8->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00d03c58;
        pTVar8[1]._vptr_TestNode = (_func_int **)CONCAT44(local_1b0._4_4_,local_1b0._0_4_);
        pTVar8[1].m_testCtx = (TestContext *)CONCAT44(local_1b0._12_4_,local_1b0._8_4_);
        *(ulong *)((long)&pTVar8[1].m_testCtx + 4) = CONCAT44(local_1b0._16_4_,local_1b0._12_4_);
        *(ulong *)((long)&pTVar8[1].m_name._M_dataplus._M_p + 4) =
             CONCAT44(local_1b0._24_4_,local_1b0._20_4_);
        std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
        vector((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               &pTVar8[1].m_name.field_2,
               (vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> *)
               (local_1b0 + 0x20));
        pTVar8[1].m_description._M_string_length = local_1b0._56_8_;
        pTVar8[1].m_description.field_2._M_allocated_capacity = local_1b0._64_8_;
        *(char **)((long)&pTVar8[1].m_description.field_2 + 8) = pcStack_168;
        *(char **)&pTVar8[1].m_nodeType = pcStack_160;
        tcu::TestNode::addChild(local_1f8,pTVar8);
        if (local_2e0[0] != (string *)local_2d0) {
          operator_delete(local_2e0[0],(ulong)(local_2d0._0_8_ + 1));
        }
        if ((undefined1 *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_) != local_2a0 + 0x10) {
          operator_delete((undefined1 *)CONCAT44(local_2a0._4_4_,local_2a0._0_4_),
                          CONCAT44(local_2a0._20_4_,local_2a0._16_4_) + 1);
        }
        if ((pointer)local_1b0._32_8_ != (pointer)0x0) {
          operator_delete((void *)local_1b0._32_8_,local_1b0._48_8_ - local_1b0._32_8_);
        }
        pTVar9 = local_238;
        pTVar8 = local_248;
        lVar14 = lVar14 + 0x10;
      } while (lVar14 != 0x40);
      tcu::TestNode::addChild(local_238,local_240);
      tcu::TestNode::addChild(pTVar9,pTVar8);
      pTVar8 = local_2b0;
      local_2b0 = (TestNode *)0x0;
      tcu::TestNode::addChild(pTVar9,pTVar8);
      pTVar8 = local_2a8;
      local_2b0 = (TestNode *)0x0;
      local_2a8 = (TestNode *)0x0;
      tcu::TestNode::addChild(pTVar9,pTVar8);
      tcu::TestNode::addChild(pTVar9,local_1f8);
      tcu::TestNode::addChild(local_38,pTVar9);
      return;
    }
  } while( true );
}

Assistant:

void populateTextureMipmappingTests (tcu::TestCaseGroup* textureMipmappingTests)
{
	tcu::TestContext&	testCtx		= textureMipmappingTests->getTestContext();

	static const struct
	{
		const char*				name;
		const Sampler::WrapMode	mode;
	} wrapModes[] =
	{
		{ "clamp",		Sampler::CLAMP_TO_EDGE		},
		{ "repeat",		Sampler::REPEAT_GL			},
		{ "mirror",		Sampler::MIRRORED_REPEAT_GL	}
	};

	static const struct
	{
		const char*					name;
		const Sampler::FilterMode	mode;
	} minFilterModes[] =
	{
		{ "nearest_nearest",	Sampler::NEAREST_MIPMAP_NEAREST	},
		{ "linear_nearest",		Sampler::LINEAR_MIPMAP_NEAREST	},
		{ "nearest_linear",		Sampler::NEAREST_MIPMAP_LINEAR	},
		{ "linear_linear",		Sampler::LINEAR_MIPMAP_LINEAR	}
	};

	static const struct
	{
		const char*					name;
		const Sampler::FilterMode	mode;
	} magFilterModes[] =
	{
		{ "nearest",	Sampler::NEAREST},
		{ "linear",		Sampler::LINEAR}
	};


	static const struct
	{
		const CoordType		type;
		const char*			name;
		const char*			desc;
	} coordTypes[] =
	{
		{ COORDTYPE_BASIC,		"basic",		"Mipmapping with translated and scaled coordinates" },
		{ COORDTYPE_AFFINE,		"affine",		"Mipmapping with affine coordinate transform"		},
		{ COORDTYPE_PROJECTED,	"projected",	"Mipmapping with perspective projection"			}
	};

	static const struct
	{
		const char*		name;
		const int		width;
		const int		height;
	} tex2DSizes[] =
	{
		{ DE_NULL,		64, 64 }, // Default.
		{ "npot",		63, 57 },
		{ "non_square",	32, 64 }
	};

	static const struct
	{
		const char*		name;
		const int		width;
		const int		height;
		const int		depth;
	} tex3DSizes[] =
	{
		{ DE_NULL,		32, 32, 32 }, // Default.
		{ "npot",		33, 29, 27 }
	};

	const int cubeMapSize = 64;

	static const struct
	{
		const CoordType		type;
		const char*			name;
		const char*			desc;
	} cubeCoordTypes[] =
	{
		{ COORDTYPE_BASIC,		"basic",		"Mipmapping with translated and scaled coordinates" },
		{ COORDTYPE_PROJECTED,	"projected",	"Mipmapping with perspective projection"			},
		{ COORDTYPE_BASIC_BIAS,	"bias",			"User-supplied bias value"							}
	};

	// 2D cases.
	{
		de::MovePtr<tcu::TestCaseGroup>	group2D				(new tcu::TestCaseGroup(testCtx, "2d", "2D Mipmap Filtering"));

		de::MovePtr<tcu::TestCaseGroup>	biasGroup2D			(new tcu::TestCaseGroup(testCtx, "bias", "User-supplied bias value"));
		de::MovePtr<tcu::TestCaseGroup>	minLodGroup2D		(new tcu::TestCaseGroup(testCtx, "min_lod", "Lod control: min lod"));
		de::MovePtr<tcu::TestCaseGroup>	maxLodGroup2D		(new tcu::TestCaseGroup(testCtx, "max_lod", "Lod control: max lod"));
		de::MovePtr<tcu::TestCaseGroup>	baseLevelGroup2D	(new tcu::TestCaseGroup(testCtx, "base_level", "Base level"));
		de::MovePtr<tcu::TestCaseGroup>	maxLevelGroup2D		(new tcu::TestCaseGroup(testCtx, "max_level", "Max level"));

		for (int coordType = 0; coordType < DE_LENGTH_OF_ARRAY(coordTypes); coordType++)
		{
			de::MovePtr<tcu::TestCaseGroup>	coordTypeGroup		(new tcu::TestCaseGroup(testCtx, coordTypes[coordType].name, coordTypes[coordType].desc));

			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				for (int wrapMode = 0; wrapMode < DE_LENGTH_OF_ARRAY(wrapModes); wrapMode++)
				{
					// Add non_square variants to basic cases only.
					int sizeEnd = coordTypes[coordType].type == COORDTYPE_BASIC ? DE_LENGTH_OF_ARRAY(tex2DSizes) : 1;

					for (int size = 0; size < sizeEnd; size++)
					{
						Texture2DMipmapTestCaseParameters	testParameters;

						testParameters.coordType	= coordTypes[coordType].type;
						testParameters.minFilter	= minFilterModes[minFilter].mode;
						testParameters.wrapS		= wrapModes[wrapMode].mode;
						testParameters.wrapT		= wrapModes[wrapMode].mode;
						testParameters.format		= VK_FORMAT_R8G8B8A8_UNORM; //not sure (GL_RGBA)
						testParameters.width		= tex2DSizes[size].width;
						testParameters.height		= tex2DSizes[size].height;
						testParameters.programs.push_back(PROGRAM_2D_FLOAT);

						std::ostringstream name;
						name << minFilterModes[minFilter].name
							 << "_" << wrapModes[wrapMode].name;

						if (tex2DSizes[size].name)
							name << "_" << tex2DSizes[size].name;

						coordTypeGroup->addChild(new TextureTestCase<Texture2DMipmapTestInstance>(testCtx, name.str().c_str(), "", testParameters));
					}
				}
			}

			group2D->addChild(coordTypeGroup.release());
		}

		// 2D bias variants.
		{
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				Texture2DMipmapTestCaseParameters	testParameters;

				testParameters.coordType	= COORDTYPE_BASIC_BIAS;
				testParameters.minFilter	= minFilterModes[minFilter].mode;
				testParameters.magFilter	= minFilterModes[minFilter].mode;
				testParameters.wrapS		= Sampler::REPEAT_GL;
				testParameters.wrapT		= Sampler::REPEAT_GL;
				testParameters.format		= VK_FORMAT_R8G8B8A8_UNORM; //not sure (GL_RGBA)
				testParameters.width		= tex2DSizes[0].width;
				testParameters.height		= tex2DSizes[0].height;
				testParameters.programs.push_back(PROGRAM_2D_FLOAT_BIAS);

				std::ostringstream name;
				name << minFilterModes[minFilter].name;

				biasGroup2D->addChild(new TextureTestCase<Texture2DMipmapTestInstance>(testCtx, name.str().c_str(), "", testParameters));
			}
		}

		// 2D LOD controls.
		{
			// MIN_LOD
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				Texture2DMipmapTestCaseParameters	testParameters;
				testParameters.minFilter	= minFilterModes[minFilter].mode;
				testParameters.programs.push_back(PROGRAM_2D_FLOAT);

				minLodGroup2D->addChild(new TextureTestCase<Texture2DMinLodTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}

			// MAX_LOD
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				Texture2DMipmapTestCaseParameters	testParameters;
				testParameters.minFilter = minFilterModes[minFilter].mode;
				testParameters.programs.push_back(PROGRAM_2D_FLOAT);

				maxLodGroup2D->addChild(new TextureTestCase<Texture2DMaxLodTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}
		}

		{
			// BASE_LEVEL
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				Texture2DMipmapTestCaseParameters	testParameters;
				testParameters.minFilter = minFilterModes[minFilter].mode;
				testParameters.minFilterName = minFilterModes[minFilter].name;
				testParameters.programs.push_back(PROGRAM_2D_FLOAT);

				baseLevelGroup2D->addChild(new TextureTestCase<Texture2DBaseLevelTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}

			// MAX_LEVEL
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				Texture2DMipmapTestCaseParameters	testParameters;
				testParameters.minFilter = minFilterModes[minFilter].mode;
				testParameters.minFilterName = minFilterModes[minFilter].name;
				testParameters.programs.push_back(PROGRAM_2D_FLOAT);

				maxLevelGroup2D->addChild(new TextureTestCase<Texture2DMaxLevelTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}
		}

		group2D->addChild(biasGroup2D.release());
		group2D->addChild(minLodGroup2D.release());
		group2D->addChild(maxLodGroup2D.release());
		group2D->addChild(baseLevelGroup2D.release());
		group2D->addChild(maxLevelGroup2D.release());

		textureMipmappingTests->addChild(group2D.release());
	}

	// Cubemap cases.
	{
		de::MovePtr<tcu::TestCaseGroup>	groupCube			(new tcu::TestCaseGroup(testCtx, "cubemap", "Cube Mipmap Filtering"));

		de::MovePtr<tcu::TestCaseGroup>	minLodGroupCube		(new tcu::TestCaseGroup(testCtx, "min_lod", "Lod control: min lod"));
		de::MovePtr<tcu::TestCaseGroup>	maxLodGroupCube		(new tcu::TestCaseGroup(testCtx, "max_lod", "Lod control: max lod"));
		de::MovePtr<tcu::TestCaseGroup>	baseLevelGroupCube	(new tcu::TestCaseGroup(testCtx, "base_level", "Base level"));
		de::MovePtr<tcu::TestCaseGroup>	maxLevelGroupCube	(new tcu::TestCaseGroup(testCtx, "max_level", "Max level"));

		for (int coordType = 0; coordType < DE_LENGTH_OF_ARRAY(cubeCoordTypes); coordType++)
		{
			de::MovePtr<tcu::TestCaseGroup>	coordTypeGroup	(new tcu::TestCaseGroup(testCtx, cubeCoordTypes[coordType].name, cubeCoordTypes[coordType].desc));

			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				for (int magFilter = 0; magFilter < DE_LENGTH_OF_ARRAY(magFilterModes); magFilter++)
				{
					for (int wrapMode = 0; wrapMode < DE_LENGTH_OF_ARRAY(wrapModes); wrapMode++)
					{
						TextureCubeMipmapTestCaseParameters	testParameters;

						testParameters.coordType		= cubeCoordTypes[coordType].type;
						testParameters.minFilter		= minFilterModes[minFilter].mode;
						testParameters.magFilter		= magFilterModes[magFilter].mode;
						testParameters.minFilterName	= minFilterModes[minFilter].name;
						testParameters.wrapS			= wrapModes[wrapMode].mode;
						testParameters.wrapT			= wrapModes[wrapMode].mode;
						testParameters.format			= VK_FORMAT_R8G8B8A8_UNORM;
						testParameters.size				= cubeMapSize;
						testParameters.programs.push_back(PROGRAM_CUBE_FLOAT);
						testParameters.programs.push_back(PROGRAM_CUBE_FLOAT_BIAS);

						std::ostringstream name;
						name << minFilterModes[minFilter].name
							 << "_" << magFilterModes[magFilter].name
							 << "_" << wrapModes[wrapMode].name;

						coordTypeGroup->addChild(new TextureTestCase<TextureCubeMipmapTestInstance>(testCtx, name.str().c_str(), "", testParameters));
					}
				}
			}

			groupCube->addChild(coordTypeGroup.release());
		}

		// Cubemap LOD controls.
		{
			// MIN_LOD
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				TextureCubeMipmapTestCaseParameters	testParameters;
				testParameters.minFilter	= minFilterModes[minFilter].mode;
				testParameters.programs.push_back(PROGRAM_CUBE_FLOAT);

				minLodGroupCube->addChild(new TextureTestCase<TextureCubeMinLodTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}

			// MAX_LOD
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				TextureCubeMipmapTestCaseParameters	testParameters;
				testParameters.minFilter	= minFilterModes[minFilter].mode;
				testParameters.programs.push_back(PROGRAM_CUBE_FLOAT);

				maxLodGroupCube->addChild(new TextureTestCase<TextureCubeMaxLodTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}
		}

		{
			// BASE_LEVEL
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				TextureCubeMipmapTestCaseParameters	testParameters;
				testParameters.minFilter = minFilterModes[minFilter].mode;
				testParameters.minFilterName = minFilterModes[minFilter].name;
				testParameters.programs.push_back(PROGRAM_CUBE_FLOAT);

				baseLevelGroupCube->addChild(new TextureTestCase<TextureCubeBaseLevelTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}

			// MAX_LEVEL
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				TextureCubeMipmapTestCaseParameters	testParameters;
				testParameters.minFilter = minFilterModes[minFilter].mode;
				testParameters.minFilterName = minFilterModes[minFilter].name;
				testParameters.programs.push_back(PROGRAM_CUBE_FLOAT);

				maxLevelGroupCube->addChild(new TextureTestCase<TextureCubeMaxLevelTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}
		}

		groupCube->addChild(minLodGroupCube.release());
		groupCube->addChild(maxLodGroupCube.release());
		groupCube->addChild(baseLevelGroupCube.release());
		groupCube->addChild(maxLevelGroupCube.release());

		textureMipmappingTests->addChild(groupCube.release());
	}

	// 3D cases.
	{
		de::MovePtr<tcu::TestCaseGroup>	group3D				(new tcu::TestCaseGroup(testCtx, "3d", "3D Mipmap Filtering"));

		de::MovePtr<tcu::TestCaseGroup>	biasGroup3D			(new tcu::TestCaseGroup(testCtx, "bias", "User-supplied bias value"));
		de::MovePtr<tcu::TestCaseGroup>	minLodGroup3D		(new tcu::TestCaseGroup(testCtx, "min_lod", "Lod control: min lod"));
		de::MovePtr<tcu::TestCaseGroup>	maxLodGroup3D		(new tcu::TestCaseGroup(testCtx, "max_lod", "Lod control: max lod"));
		de::MovePtr<tcu::TestCaseGroup>	baseLevelGroup3D	(new tcu::TestCaseGroup(testCtx, "base_level", "Base level"));
		de::MovePtr<tcu::TestCaseGroup>	maxLevelGroup3D		(new tcu::TestCaseGroup(testCtx, "max_level", "Max level"));

		for (int coordType = 0; coordType < DE_LENGTH_OF_ARRAY(coordTypes); coordType++)
		{
			de::MovePtr<tcu::TestCaseGroup>	coordTypeGroup	(new tcu::TestCaseGroup(testCtx, coordTypes[coordType].name, coordTypes[coordType].desc));

			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				for (int wrapMode = 0; wrapMode < DE_LENGTH_OF_ARRAY(wrapModes); wrapMode++)
				{
					// Add other size variants to basic cases only.
					int sizeEnd = coordTypes[coordType].type == COORDTYPE_BASIC ? DE_LENGTH_OF_ARRAY(tex3DSizes) : 1;

					Texture3DMipmapTestCaseParameters	testParameters;

					testParameters.coordType		= coordTypes[coordType].type;
					testParameters.minFilter		= minFilterModes[minFilter].mode;
					testParameters.minFilterName	= minFilterModes[minFilter].name;
					testParameters.wrapR			= wrapModes[wrapMode].mode;
					testParameters.wrapS			= wrapModes[wrapMode].mode;
					testParameters.wrapT			= wrapModes[wrapMode].mode;
					testParameters.format			= VK_FORMAT_R8G8B8A8_UNORM;
					testParameters.programs.push_back(PROGRAM_3D_FLOAT);

					for (int size = 0; size < sizeEnd; size++)
					{
						testParameters.width			= tex3DSizes[size].width;
						testParameters.height			= tex3DSizes[size].height;
						testParameters.depth			= tex3DSizes[size].depth;

						std::ostringstream name;
						name << minFilterModes[minFilter].name
							 << "_" << wrapModes[wrapMode].name;

						if (tex3DSizes[size].name)
							name << "_" << tex3DSizes[size].name;

						coordTypeGroup->addChild(new TextureTestCase<Texture3DMipmapTestInstance>(testCtx, name.str().c_str(), "", testParameters));
					}
				}
			}

			group3D->addChild(coordTypeGroup.release());
		}

		// 3D bias variants.
		{
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				Texture3DMipmapTestCaseParameters	testParameters;
				testParameters.coordType			= COORDTYPE_BASIC_BIAS;
				testParameters.minFilter			= minFilterModes[minFilter].mode;
				testParameters.wrapR				= Sampler::REPEAT_GL;
				testParameters.wrapS				= Sampler::REPEAT_GL;
				testParameters.wrapT				= Sampler::REPEAT_GL;
				testParameters.format				= VK_FORMAT_R8G8B8A8_UNORM;
				testParameters.width				= tex3DSizes[0].width;
				testParameters.height				= tex3DSizes[0].height;
				testParameters.depth				= tex3DSizes[0].depth;

				testParameters.programs.push_back(PROGRAM_3D_FLOAT);
				testParameters.programs.push_back(PROGRAM_3D_FLOAT_BIAS);

				biasGroup3D->addChild(new TextureTestCase<Texture3DMipmapTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}
		}

		// 3D LOD controls.
		{
			// MIN_LOD
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				Texture3DMipmapTestCaseParameters	testParameters;
				testParameters.minFilter			= minFilterModes[minFilter].mode;
				testParameters.programs.push_back(PROGRAM_3D_FLOAT);

				minLodGroup3D->addChild(new TextureTestCase<Texture3DMinLodTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}

			// MAX_LOD
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				Texture3DMipmapTestCaseParameters	testParameters;
				testParameters.minFilter			= minFilterModes[minFilter].mode;
				testParameters.programs.push_back(PROGRAM_3D_FLOAT);

				maxLodGroup3D->addChild(new TextureTestCase<Texture3DMaxLodTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}
		}

		{
			// BASE_LEVEL
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				Texture3DMipmapTestCaseParameters	testParameters;
				testParameters.minFilter			= minFilterModes[minFilter].mode;
				testParameters.minFilterName		= minFilterModes[minFilter].name;
				testParameters.programs.push_back(PROGRAM_3D_FLOAT);

				baseLevelGroup3D->addChild(new TextureTestCase<Texture3DBaseLevelTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}

			// MAX_LEVEL
			for (int minFilter = 0; minFilter < DE_LENGTH_OF_ARRAY(minFilterModes); minFilter++)
			{
				Texture3DMipmapTestCaseParameters	testParameters;
				testParameters.minFilter			= minFilterModes[minFilter].mode;
				testParameters.minFilterName		= minFilterModes[minFilter].name;
				testParameters.programs.push_back(PROGRAM_3D_FLOAT);

				maxLevelGroup3D->addChild(new TextureTestCase<Texture3DMaxLevelTestInstance>(testCtx, minFilterModes[minFilter].name, "", testParameters));
			}
		}

		group3D->addChild(biasGroup3D.release());
		group3D->addChild(minLodGroup3D.release());
		group3D->addChild(maxLodGroup3D.release());
		group3D->addChild(baseLevelGroup3D.release());
		group3D->addChild(maxLevelGroup3D.release());

		textureMipmappingTests->addChild(group3D.release());
	}
}